

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_kfold_int64arith(jit_State *J)

{
  TRef TVar1;
  jit_State *in_RDI;
  uint64_t in_stack_ffffffffffffffe8;
  
  kfold_int64arith(*(uint64_t *)(ulong)(in_RDI->fold).left.field_1.op12,
                   *(uint64_t *)(ulong)(in_RDI->fold).right.field_1.op12,
                   (uint)(in_RDI->fold).ins.field_1.o);
  TVar1 = lj_ir_kint64(in_RDI,in_stack_ffffffffffffffe8);
  return TVar1;
}

Assistant:

static uint64_t kfold_int64arith(uint64_t k1, uint64_t k2, IROp op)
{
  switch (op) {
#if LJ_64 || LJ_HASFFI
  case IR_ADD: k1 += k2; break;
  case IR_SUB: k1 -= k2; break;
#endif
#if LJ_HASFFI
  case IR_MUL: k1 *= k2; break;
  case IR_BAND: k1 &= k2; break;
  case IR_BOR: k1 |= k2; break;
  case IR_BXOR: k1 ^= k2; break;
#endif
  default: UNUSED(k2); lua_assert(0); break;
  }
  return k1;
}